

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 local_38 [8];
  path root;
  path *this_local;
  
  root._path.field_2._8_8_ = this;
  root_name((path *)local_38,this);
  uVar1 = std::__cxx11::string::length();
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < uVar1) {
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == '/') {
      path<char[2],ghc::filesystem::path>(__return_storage_ptr__,(char (*) [2])"/",auto_format);
      goto LAB_001a3ec2;
    }
  }
  path(__return_storage_ptr__);
LAB_001a3ec2:
  ~path((path *)local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    path root = root_name();
    if (_path.length() > root._path.length() && _path[root._path.length()] == '/') {
        return path("/");
    }
    return path();
}